

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

Sink * __thiscall jbcoin::Logs::get(Logs *this,string *name)

{
  pointer ppVar1;
  type pSVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>,_bool>
  pVar3;
  unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> local_38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>
  local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>,_bool>
  result;
  lock_guard<std::mutex> lock;
  string *name_local;
  Logs *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&result.second,&this->mutex_);
  (*this->_vptr_Logs[2])(&local_38,this,name,(ulong)this->thresh_);
  pVar3 = std::
          map<std::__cxx11::string,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>,beast::iless,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>>>
          ::
          emplace<std::__cxx11::string_const&,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>
                    ((map<std::__cxx11::string,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>,beast::iless,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>>>
                      *)&this->sinks_,name,&local_38);
  local_30 = pVar3.first._M_node;
  result.first._M_node._0_1_ = pVar3.second;
  std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>::~unique_ptr
            (&local_38);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>
           ::operator->(&local_30);
  pSVar2 = std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>::
           operator*(&ppVar1->second);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&result.second);
  return pSVar2;
}

Assistant:

beast::Journal::Sink&
Logs::get (std::string const& name)
{
    std::lock_guard <std::mutex> lock (mutex_);
    auto const result =
        sinks_.emplace(name, makeSink(name, thresh_));
    return *result.first->second;
}